

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipmerge.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  __int32_t **pp_Var8;
  long lVar9;
  undefined8 uVar10;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  FILE *pFVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  int err;
  int err_1;
  ulong local_4e8;
  void *local_4e0;
  ulong local_4d8;
  char **local_4d0;
  ulong local_4c8;
  long local_4c0;
  undefined1 local_4b8 [24];
  zip_uint64_t local_4a0;
  zip_uint32_t local_488;
  zip_stat st;
  zip_error_t error;
  
  progname = *argv;
  confirm = 1;
  name_flags = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"hVDiIsS"), 0x52 < iVar1) {
        if (iVar1 < 0x69) {
          if (iVar1 != 0x53) {
            if (iVar1 == 0x56) {
              pcVar17 = version_string;
            }
            else {
              if (iVar1 != 0x68) goto LAB_00101883;
              fputs(help_head,_stdout);
              printf("usage: %s [-DhIiSsV] target-zip zip...\n",progname);
              pcVar17 = help;
            }
            fputs(pcVar17,_stdout);
            goto LAB_001018c2;
          }
          confirm = confirm & 0xffffffcfU | 0x20;
        }
        else if (iVar1 == 0x69) {
          confirm = confirm & 0xfffffffe;
        }
        else {
          if (iVar1 != 0x73) goto LAB_00101883;
          confirm = confirm & 0xffffffcfU | 0x10;
        }
      }
      if (iVar1 != 0x44) break;
      name_flags = name_flags | 2;
    }
    if (iVar1 != 0x49) break;
    name_flags = name_flags | 1;
  }
  if ((iVar1 != -1) || (lVar18 = (long)_optind, argc < _optind + 2)) {
LAB_00101883:
    fprintf(_stderr,"usage: %s [-DhIiSsV] target-zip zip...\n",progname);
    exit(2);
  }
  iVar1 = _optind + 1;
  pcVar17 = argv[lVar18];
  local_4e8 = (ulong)(uint)(argc - iVar1);
  _optind = iVar1;
  pvVar3 = malloc(local_4e8 * 8);
  if (pvVar3 == (void *)0x0) {
    fprintf(_stderr,"%s: out of memory\n",progname);
  }
  else {
    lVar4 = zip_open(pcVar17,1,&err);
    if (lVar4 == 0) {
      zip_error_init_with_code(&error,err);
      pFVar15 = _stderr;
      pcVar12 = progname;
      uVar5 = zip_error_strerror(&error);
LAB_001017f4:
      fprintf(pFVar15,"%s: can\'t open zip archive \'%s\': %s\n",pcVar12,pcVar17,uVar5);
      zip_error_fini(&error);
    }
    else {
      if (argc == iVar1) {
        iVar1 = zip_close();
        if (-1 < iVar1) goto LAB_001018c2;
      }
      else {
        local_4d0 = argv + lVar18 + 1;
        local_4d8 = (ulong)((int)local_4e8 + (uint)((int)local_4e8 == 0));
        uVar14 = 0;
        local_4e0 = pvVar3;
        do {
          pcVar16 = local_4d0[uVar14];
          lVar18 = zip_open(pcVar16,0,&err_1);
          if (lVar18 == 0) {
            zip_error_init_with_code(&error,err_1);
            pFVar15 = _stderr;
            pcVar12 = progname;
            uVar5 = zip_error_strerror(&error);
            pcVar17 = pcVar16;
            goto LAB_001017f4;
          }
          local_4c0 = zip_get_num_entries(lVar18);
          pFVar15 = _stderr;
          pcVar12 = progname;
          if (local_4c0 < 0) {
            uVar5 = zip_strerror(lVar4);
            pcVar7 = "%s: cannot get number of entries for \'%s\': %s\n";
            goto LAB_00101833;
          }
          if (local_4c0 != 0) {
            lVar13 = 0;
            local_4c8 = uVar14;
            do {
              uVar5 = zip_get_name(lVar18,lVar13,0);
              lVar6 = zip_name_locate(lVar4,uVar5,name_flags);
              if (lVar6 < 0) {
                lVar6 = zip_source_zip(lVar4,lVar18,lVar13,0,0,0);
                if ((lVar6 == 0) || (lVar9 = zip_add(lVar4,uVar5,lVar6), lVar9 < 0)) {
                  zip_source_free(lVar6);
                  pFVar15 = _stderr;
                  pcVar12 = progname;
                  uVar10 = zip_strerror(lVar4);
                  pcVar16 = "%s: cannot add \'%s\' to `%s\': %s\n";
LAB_001016d8:
                  fprintf(pFVar15,pcVar16,pcVar12,uVar5,pcVar17,uVar10);
LAB_001017a6:
                  zip_close(lVar18);
                  goto LAB_001017ab;
                }
              }
              else if ((confirm & 1U) == 0) {
                if ((confirm & 2U) == 0) {
                  iVar2 = zip_stat_index(lVar4,lVar6,8,&st);
                  pFVar15 = _stderr;
                  pcVar12 = progname;
                  if (iVar2 < 0) {
                    uVar5 = zip_strerror(lVar4);
                  }
                  else {
                    iVar2 = zip_stat_index(lVar18,lVar13,0,local_4b8);
                    pFVar15 = _stderr;
                    pcVar12 = progname;
                    if (-1 < iVar2) {
                      if (st.crc == local_488 && st.size == local_4a0) {
                        if ((confirm & 0x10U) != 0) goto LAB_001015a4;
                        if ((confirm & 0x20U) != 0) goto LAB_00101618;
                      }
                      printf("replace \'%s\' (%lu / %08x) in `%s\'\n   with \'%s\' (%lu / %08x) from `%s\'? "
                             ,st.name);
                      fflush(_stdout);
                      pcVar7 = fgets((char *)&error,0x400,_stdin);
                      pFVar15 = _stderr;
                      pcVar12 = progname;
                      if (pcVar7 != (char *)0x0) {
                        pp_Var8 = __ctype_tolower_loc();
                        if ((*pp_Var8)[(byte)error.zip_err] == 0x79) goto LAB_001015a4;
                        goto LAB_00101618;
                      }
                      piVar11 = __errno_location();
                      pcVar17 = strerror(*piVar11);
                      fprintf(pFVar15,"%s: read error from stdin: %s\n",pcVar12,pcVar17);
                      goto LAB_001017a6;
                    }
                    uVar5 = zip_strerror(lVar18);
                    lVar6 = lVar13;
                    pcVar17 = pcVar16;
                  }
                  fprintf(pFVar15,"%s: cannot stat file %lu in \'%s\': %s\n",pcVar12,lVar6,pcVar17,
                          uVar5);
                  goto LAB_001017a6;
                }
              }
              else {
LAB_001015a4:
                lVar9 = zip_source_zip(lVar4,lVar18,lVar13,0,0,0);
                if ((lVar9 == 0) || (iVar2 = zip_replace(lVar4,lVar6,lVar9), iVar2 < 0)) {
                  zip_source_free(lVar9);
                  pFVar15 = _stderr;
                  pcVar12 = progname;
                  uVar10 = zip_strerror(lVar4);
                  pcVar16 = "%s: cannot replace \'%s\' in `%s\': %s\n";
                  goto LAB_001016d8;
                }
              }
LAB_00101618:
              lVar13 = lVar13 + 1;
              uVar14 = local_4c8;
              pvVar3 = local_4e0;
            } while (local_4c0 != lVar13);
          }
          *(long *)((long)pvVar3 + uVar14 * 8) = lVar18;
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_4d8);
        iVar2 = zip_close();
        if (-1 < iVar2) {
          if (argc != iVar1) {
            iVar1 = (int)local_4e8;
            uVar14 = 0;
            do {
              zip_close();
              uVar14 = uVar14 + 1;
            } while (iVar1 + (uint)(iVar1 == 0) != uVar14);
          }
LAB_001018c2:
          exit(0);
        }
      }
      pFVar15 = _stderr;
      pcVar12 = progname;
      uVar5 = zip_strerror(lVar4);
      pcVar7 = "%s: cannot write zip archive \'%s\': %s\n";
      pcVar16 = pcVar17;
LAB_00101833:
      fprintf(pFVar15,pcVar7,pcVar12,pcVar16,uVar5);
    }
  }
LAB_001017ab:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[]) {
    zip_t *za;
    zip_t **zs;
    int c, err;
    unsigned int i, n;
    char *tname;

    progname = argv[0];

    confirm = CONFIRM_ALL_YES;
    name_flags = 0;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'D':
	    name_flags |= ZIP_FL_NODIR;
	    break;
	case 'i':
	    confirm &= ~CONFIRM_ALL_YES;
	    break;
	case 'I':
	    name_flags |= ZIP_FL_NOCASE;
	    break;
	case 's':
	    confirm &= ~CONFIRM_SAME_NO;
	    confirm |= CONFIRM_SAME_YES;
	    break;
	case 'S':
	    confirm &= ~CONFIRM_SAME_YES;
	    confirm |= CONFIRM_SAME_NO;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc < optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    tname = argv[optind++];
    argv += optind;

    n = (unsigned int)(argc - optind);
    if ((zs = (zip_t **)malloc(sizeof(zs[0]) * n)) == NULL) {
	fprintf(stderr, "%s: out of memory\n", progname);
	exit(1);
    }

    if ((za = zip_open(tname, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", progname, tname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    for (i = 0; i < n; i++) {
	if ((zs[i] = merge_zip(za, tname, argv[i])) == NULL)
	    exit(1);
    }

    if (zip_close(za) < 0) {
	fprintf(stderr, "%s: cannot write zip archive '%s': %s\n", progname, tname, zip_strerror(za));
	exit(1);
    }

    for (i = 0; i < n; i++)
	zip_close(zs[i]);

    exit(0);
}